

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int Index(int ndim,int *subscript,int *dims)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ndim;
  if (ndim < 1) {
    uVar3 = uVar2;
  }
  iVar4 = 1;
  iVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + subscript[uVar2] * iVar4;
    iVar4 = iVar4 * dims[uVar2];
  }
  return iVar1;
}

Assistant:

int Index(int ndim, int subscript[], int dims[])
{
    int idx = 0, i, factor=1;
    for(i=0;i<ndim;i++){
        idx += subscript[i]*factor;
        factor *= dims[i];
    }
    return idx;
}